

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_surjectionproof_serialize
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,
              secp256k1_surjectionproof *proof)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  char *pcVar5;
  
  if (output == (uchar *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "output != NULL";
  }
  else if (outputlen == (size_t *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "outputlen != NULL";
  }
  else {
    if (proof != (secp256k1_surjectionproof *)0x0) {
      sVar1 = proof->n_inputs;
      uVar3 = sVar1 + 7 >> 3;
      sVar2 = secp256k1_count_bits_set(proof->used_inputs,uVar3);
      uVar3 = uVar3 + sVar2 * 0x20 + 0x22;
      if (*outputlen < uVar3) {
        return 0;
      }
      *output = (uchar)sVar1;
      output[1] = *(uchar *)((long)&proof->n_inputs + 1);
      memcpy(output + 2,proof->used_inputs,proof->n_inputs + 7 >> 3);
      memcpy(output + (proof->n_inputs + 7 >> 3) + 2,proof->data,sVar2 * 0x20 + 0x20);
      *outputlen = uVar3;
      return 1;
    }
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "proof != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar5,pvVar4);
  return 0;
}

Assistant:

int secp256k1_surjectionproof_serialize(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_surjectionproof *proof) {
    size_t signature_len;
    size_t serialized_len;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(proof != NULL);
    (void) ctx;

    signature_len = 32 * (1 + secp256k1_count_bits_set(proof->used_inputs, (proof->n_inputs + 7) / 8));
    serialized_len = 2 + (proof->n_inputs + 7) / 8 + signature_len;
    if (*outputlen < serialized_len) {
        return 0;
    }

    output[0] = proof->n_inputs % 0x100;
    output[1] = proof->n_inputs / 0x100;
    memcpy(&output[2], proof->used_inputs, (proof->n_inputs + 7) / 8);
    memcpy(&output[2 + (proof->n_inputs + 7) / 8], proof->data, signature_len);
    *outputlen = serialized_len;

    return 1;
}